

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void OPNCheckNativeSampleRate(FM_OPN *OPN)

{
  int iVar1;
  int sRateDiff;
  UINT32 nativeSRate;
  UINT32 pres;
  FM_OPN *OPN_local;
  
  sRateDiff = 0x48;
  if ((OPN->type & 4) != 0) {
    sRateDiff = 0x90;
  }
  iVar1 = (OPN->ST).rate - (OPN->ST).clock / (uint)sRateDiff;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  OPN->smpRateNative = iVar1 < 3;
  return;
}

Assistant:

static void OPNCheckNativeSampleRate(FM_OPN *OPN)
{
	UINT32 pres;
	UINT32 nativeSRate;
	int sRateDiff;
	
	pres = 6*12;	// default prescaler
	if (OPN->type & TYPE_6CH)
		pres *= 2;
	nativeSRate = OPN->ST.clock / pres;
	sRateDiff = (int)OPN->ST.rate - (int)nativeSRate;
	OPN->smpRateNative = (abs(sRateDiff) <= 2);
	
	return;
}